

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseVariants(AsciiParser *this,VariantSelectionMap *out_map)

{
  bool bVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  char c;
  string var;
  string key;
  string local_1c8;
  ostringstream ss_e;
  
  bVar1 = Expect(this,'{');
  if ((!bVar1) || (bVar1 = SkipWhitespaceAndNewline(this,true), !bVar1)) {
    return false;
  }
  while (bVar1 = Eof(this), !bVar1) {
    bVar1 = Char1(this,&c);
    if (!bVar1) {
      return false;
    }
    if (c == '}') break;
    bVar1 = Rewind(this,1);
    if (!bVar1) {
      return false;
    }
    key._M_dataplus._M_p = (pointer)&key.field_2;
    key._M_string_length = 0;
    key.field_2._M_local_buf[0] = '\0';
    var._M_dataplus._M_p = (pointer)&var.field_2;
    var._M_string_length = 0;
    var.field_2._M_local_buf[0] = '\0';
    bVar1 = ParseVariantsElement(this,&key,&var);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ParseVariants");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x42b);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)&ss_e,"Failed to parse an element of `variants`.");
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_1c8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_00289584:
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      return false;
    }
    bVar1 = SkipWhitespaceAndNewline(this,true);
    if (!bVar1) goto LAB_00289584;
    pmVar2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](out_map,&key);
    ::std::__cxx11::string::_M_assign((string *)pmVar2);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  bVar1 = SkipWhitespaceAndNewline(this,true);
  return bVar1;
}

Assistant:

bool AsciiParser::ParseVariants(VariantSelectionMap *out_map) {
  // '{' (string name '=' value)+ '}'
  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      std::string key;
      std::string var;
      if (!ParseVariantsElement(&key, &var)) {
        PUSH_ERROR_AND_RETURN("Failed to parse an element of `variants`.");
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      DCOUT("Add to variants: " << key);
      (*out_map)[key] = var;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  return true;
}